

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon.c
# Opt level: O0

void ihevc_itrans_recon_4x4
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *in_RCX;
  byte *in_RDX;
  short *in_RSI;
  short *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint in_stack_00000010;
  WORD32 itrans_out;
  WORD32 trans_size;
  WORD16 *pi2_tmp_orig;
  WORD32 shift;
  WORD32 add;
  WORD32 o [2];
  WORD32 e [2];
  WORD32 j;
  char local_b8;
  char local_b4;
  int local_b0;
  int local_ac;
  char local_a8;
  char local_a4;
  int local_a0;
  int local_9c;
  char local_98;
  char local_94;
  int local_90;
  int local_8c;
  char local_88;
  char local_84;
  int local_80;
  int local_7c;
  short local_78;
  short local_74;
  short local_70;
  short local_6c;
  short local_68;
  short local_64;
  short local_60;
  short local_5c;
  int local_2c;
  char *local_20;
  byte *local_18;
  short *local_10;
  short *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    if ((in_stack_00000010 & 1) == 1) {
      memset(local_10,0,8);
    }
    else {
      iVar1 = local_8[in_R8D] * 0x53 + local_8[in_R8D * 3] * 0x24;
      iVar2 = local_8[in_R8D] * 0x24 + local_8[in_R8D * 3] * -0x53;
      iVar3 = *local_8 * 0x40 + local_8[in_R8D << 1] * 0x40;
      iVar4 = *local_8 * 0x40 + local_8[in_R8D << 1] * -0x40;
      if (iVar3 + iVar1 + 0x40 >> 7 < 0x8000) {
        if (iVar3 + iVar1 + 0x40 >> 7 < -0x8000) {
          local_60 = -0x8000;
        }
        else {
          local_60 = (short)(iVar3 + iVar1 + 0x40 >> 7);
        }
        local_5c = local_60;
      }
      else {
        local_5c = 0x7fff;
      }
      *local_10 = local_5c;
      if (iVar4 + iVar2 + 0x40 >> 7 < 0x8000) {
        if (iVar4 + iVar2 + 0x40 >> 7 < -0x8000) {
          local_68 = -0x8000;
        }
        else {
          local_68 = (short)(iVar4 + iVar2 + 0x40 >> 7);
        }
        local_64 = local_68;
      }
      else {
        local_64 = 0x7fff;
      }
      local_10[1] = local_64;
      if ((iVar4 - iVar2) + 0x40 >> 7 < 0x8000) {
        if ((iVar4 - iVar2) + 0x40 >> 7 < -0x8000) {
          local_70 = -0x8000;
        }
        else {
          local_70 = (short)((iVar4 - iVar2) + 0x40 >> 7);
        }
        local_6c = local_70;
      }
      else {
        local_6c = 0x7fff;
      }
      local_10[2] = local_6c;
      if ((iVar3 - iVar1) + 0x40 >> 7 < 0x8000) {
        if ((iVar3 - iVar1) + 0x40 >> 7 < -0x8000) {
          local_78 = -0x8000;
        }
        else {
          local_78 = (short)((iVar3 - iVar1) + 0x40 >> 7);
        }
        local_74 = local_78;
      }
      else {
        local_74 = 0x7fff;
      }
      local_10[3] = local_74;
    }
    local_8 = local_8 + 1;
    local_10 = local_10 + 4;
    in_stack_00000010 = (int)in_stack_00000010 >> 1;
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    iVar1 = local_10[4] * 0x53 + local_10[0xc] * 0x24;
    iVar2 = local_10[4] * 0x24 + local_10[0xc] * -0x53;
    iVar3 = *local_10 * 0x40 + local_10[8] * 0x40;
    iVar4 = *local_10 * 0x40 + local_10[8] * -0x40;
    if (iVar3 + iVar1 + 0x800 >> 0xc < 0x8000) {
      if (iVar3 + iVar1 + 0x800 >> 0xc < -0x8000) {
        local_80 = -0x8000;
      }
      else {
        local_80 = iVar3 + iVar1 + 0x800 >> 0xc;
      }
      local_7c = local_80;
    }
    else {
      local_7c = 0x7fff;
    }
    if ((int)(local_7c + (uint)*local_18) < 0x100) {
      if ((int)(local_7c + (uint)*local_18) < 0) {
        local_88 = '\0';
      }
      else {
        local_88 = (char)local_7c + *local_18;
      }
      local_84 = local_88;
    }
    else {
      local_84 = -1;
    }
    *local_20 = local_84;
    if (iVar4 + iVar2 + 0x800 >> 0xc < 0x8000) {
      if (iVar4 + iVar2 + 0x800 >> 0xc < -0x8000) {
        local_90 = -0x8000;
      }
      else {
        local_90 = iVar4 + iVar2 + 0x800 >> 0xc;
      }
      local_8c = local_90;
    }
    else {
      local_8c = 0x7fff;
    }
    if ((int)(local_8c + (uint)local_18[1]) < 0x100) {
      if ((int)(local_8c + (uint)local_18[1]) < 0) {
        local_98 = '\0';
      }
      else {
        local_98 = (char)local_8c + local_18[1];
      }
      local_94 = local_98;
    }
    else {
      local_94 = -1;
    }
    local_20[1] = local_94;
    if ((iVar4 - iVar2) + 0x800 >> 0xc < 0x8000) {
      if ((iVar4 - iVar2) + 0x800 >> 0xc < -0x8000) {
        local_a0 = -0x8000;
      }
      else {
        local_a0 = (iVar4 - iVar2) + 0x800 >> 0xc;
      }
      local_9c = local_a0;
    }
    else {
      local_9c = 0x7fff;
    }
    if ((int)(local_9c + (uint)local_18[2]) < 0x100) {
      if ((int)(local_9c + (uint)local_18[2]) < 0) {
        local_a8 = '\0';
      }
      else {
        local_a8 = (char)local_9c + local_18[2];
      }
      local_a4 = local_a8;
    }
    else {
      local_a4 = -1;
    }
    local_20[2] = local_a4;
    if ((iVar3 - iVar1) + 0x800 >> 0xc < 0x8000) {
      if ((iVar3 - iVar1) + 0x800 >> 0xc < -0x8000) {
        local_b0 = -0x8000;
      }
      else {
        local_b0 = (iVar3 - iVar1) + 0x800 >> 0xc;
      }
      local_ac = local_b0;
    }
    else {
      local_ac = 0x7fff;
    }
    if ((int)(local_ac + (uint)local_18[3]) < 0x100) {
      if ((int)(local_ac + (uint)local_18[3]) < 0) {
        local_b8 = '\0';
      }
      else {
        local_b8 = (char)local_ac + local_18[3];
      }
      local_b4 = local_b8;
    }
    else {
      local_b4 = -1;
    }
    local_20[3] = local_b4;
    local_10 = local_10 + 1;
    local_18 = local_18 + in_R9D;
    local_20 = local_20 + in_stack_00000008;
  }
  return;
}

Assistant:

void ihevc_itrans_recon_4x4(WORD16 *pi2_src,
                            WORD16 *pi2_tmp,
                            UWORD8 *pu1_pred,
                            UWORD8 *pu1_dst,
                            WORD32 src_strd,
                            WORD32 pred_strd,
                            WORD32 dst_strd,
                            WORD32 zero_cols,
                            WORD32 zero_rows)

{
    WORD32 j;
    WORD32 e[2], o[2];
    WORD32 add;
    WORD32 shift;
    WORD16 *pi2_tmp_orig;
    WORD32 trans_size;
    UNUSED(zero_rows);
    trans_size = TRANS_SIZE_4;

    pi2_tmp_orig = pi2_tmp;

    /* Inverse Transform 1st stage */
    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);

    for(j = 0; j < trans_size; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
        }
        else
        {

            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            o[0] = g_ai2_ihevc_trans_4[1][0] * pi2_src[src_strd]
                            + g_ai2_ihevc_trans_4[3][0] * pi2_src[3 * src_strd];
            o[1] = g_ai2_ihevc_trans_4[1][1] * pi2_src[src_strd]
                            + g_ai2_ihevc_trans_4[3][1] * pi2_src[3 * src_strd];
            e[0] = g_ai2_ihevc_trans_4[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_4[2][0] * pi2_src[2 * src_strd];
            e[1] = g_ai2_ihevc_trans_4[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_4[2][1] * pi2_src[2 * src_strd];

            pi2_tmp[0] =
                            CLIP_S16(((e[0] + o[0] + add) >> shift));
            pi2_tmp[1] =
                            CLIP_S16(((e[1] + o[1] + add) >> shift));
            pi2_tmp[2] =
                            CLIP_S16(((e[1] - o[1] + add) >> shift));
            pi2_tmp[3] =
                            CLIP_S16(((e[0] - o[0] + add) >> shift));

        }
        pi2_src++;
        pi2_tmp += trans_size;
        zero_cols = zero_cols >> 1;
    }

    pi2_tmp = pi2_tmp_orig;

    /* Inverse Transform 2nd stage */
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);

    for(j = 0; j < trans_size; j++)
    {
        WORD32 itrans_out;
        /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
        o[0] = g_ai2_ihevc_trans_4[1][0] * pi2_tmp[trans_size]
                        + g_ai2_ihevc_trans_4[3][0] * pi2_tmp[3 * trans_size];
        o[1] = g_ai2_ihevc_trans_4[1][1] * pi2_tmp[trans_size]
                        + g_ai2_ihevc_trans_4[3][1] * pi2_tmp[3 * trans_size];
        e[0] = g_ai2_ihevc_trans_4[0][0] * pi2_tmp[0]
                        + g_ai2_ihevc_trans_4[2][0] * pi2_tmp[2 * trans_size];
        e[1] = g_ai2_ihevc_trans_4[0][1] * pi2_tmp[0]
                        + g_ai2_ihevc_trans_4[2][1] * pi2_tmp[2 * trans_size];

        itrans_out =
                        CLIP_S16(((e[0] + o[0] + add) >> shift));
        pu1_dst[0] = CLIP_U8((itrans_out + pu1_pred[0]));
        itrans_out =
                        CLIP_S16(((e[1] + o[1] + add) >> shift));
        pu1_dst[1] = CLIP_U8((itrans_out + pu1_pred[1]));
        itrans_out =
                        CLIP_S16(((e[1] - o[1] + add) >> shift));
        pu1_dst[2] = CLIP_U8((itrans_out + pu1_pred[2]));
        itrans_out =
                        CLIP_S16(((e[0] - o[0] + add) >> shift));
        pu1_dst[3] = CLIP_U8((itrans_out + pu1_pred[3]));

        pi2_tmp++;
        pu1_pred += pred_strd;
        pu1_dst += dst_strd;

    }
}